

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O3

int encode_decode_large(test_state *state)

{
  aec_stream_conflict *strm;
  size_t sVar1;
  int iVar2;
  FILE *pFVar3;
  uint uVar4;
  char *__s;
  int i;
  ulong uVar5;
  int i_1;
  char fname [1028];
  char fbase [1024];
  
  strm = (aec_stream_conflict *)state->strm;
  strm->avail_in = state->ibuf_len;
  strm->avail_out = state->cbuf_len;
  strm->next_in = state->ubuf;
  strm->next_out = state->cbuf;
  iVar2 = aec_encode_init((aec_stream *)strm);
  if (iVar2 == 0) {
    if (state->dump == 0) {
      uVar4 = 0;
    }
    else {
      snprintf(fbase,0x400,"BPS%02iID%iBS%02iRSI%04iFLG%04i",(ulong)strm->bits_per_sample,
               (ulong)(uint)state->id,(ulong)strm->block_size,(ulong)strm->rsi,(ulong)strm->flags);
      snprintf(fname,0x404,"%s.dat",fbase);
      pFVar3 = fopen(fname,"wb");
      if (pFVar3 == (FILE *)0x0) goto LAB_00105fe3;
      fputc(strm->bits_per_sample,pFVar3);
      uVar4 = strm->block_size >> 8 | 0xf0;
      fputc(uVar4,pFVar3);
      fwrite(strm->next_in,strm->avail_in,1,pFVar3);
      fclose(pFVar3);
      uVar4 = uVar4 & 0xffffffdf;
    }
    iVar2 = aec_encode((aec_stream *)strm,1);
    if (iVar2 != 0) {
      __s = "Encode failed.";
      goto LAB_00105f00;
    }
    aec_encode_end((aec_stream *)strm);
    if (state->dump != 0) {
      snprintf(fname,0x403,"%s.rz",fbase);
      pFVar3 = fopen(fname,"wb");
      if (pFVar3 == (FILE *)0x0) {
LAB_00105fe3:
        fprintf(_stderr,"ERROR: cannot open dump file %s\n",fname);
        return 99;
      }
      fputc(strm->bits_per_sample,pFVar3);
      fputc(uVar4,pFVar3);
      fwrite(state->cbuf,strm->total_out,1,pFVar3);
      fclose(pFVar3);
    }
    sVar1 = strm->total_out;
    strm->avail_in = sVar1;
    strm->avail_out = state->buf_len;
    strm->next_in = state->cbuf;
    strm->next_out = state->obuf;
    iVar2 = aec_decode_init(strm);
    if (iVar2 == 0) {
      iVar2 = aec_decode(strm,1);
      if (iVar2 == 0) {
        iVar2 = bcmp(state->ubuf,state->obuf,state->ibuf_len);
        if (iVar2 != 0) {
          printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
          printf("\nuncompressed buf");
          uVar5 = 0;
          do {
            if ((uVar5 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->ubuf[uVar5]);
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x50);
          printf("\n\ncompressed buf len %zu",sVar1);
          uVar5 = 0;
          do {
            if ((uVar5 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->cbuf[uVar5]);
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x50);
          printf("\n\ndecompressed buf");
          uVar5 = 0;
          do {
            if ((uVar5 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->obuf[uVar5]);
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x50);
          putchar(10);
          return 99;
        }
        aec_decode_end(strm);
        return 0;
      }
      __s = "Decode failed.";
      goto LAB_00105f00;
    }
  }
  __s = "Init failed.";
LAB_00105f00:
  puts(__s);
  return 99;
}

Assistant:

int encode_decode_large(struct test_state *state)
{
    int status;
    int bflags = 0;
    size_t to;
    char fbase[1024];
    struct aec_stream *strm = state->strm;

    strm->avail_in = state->ibuf_len;
    strm->avail_out = state->cbuf_len;
    strm->next_in = state->ubuf;
    strm->next_out = state->cbuf;

    status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }
    if (state->dump) {
        char fname[1024 + 4];
        FILE *fp;
        snprintf(fbase, sizeof(fbase), "BPS%02iID%iBS%02iRSI%04iFLG%04i",
                 strm->bits_per_sample,
                 state->id,
                 strm->block_size,
                 strm->rsi,
                 strm->flags);
        snprintf(fname, sizeof(fname), "%s.dat", fbase);
        if ((fp = fopen(fname, "wb")) == NULL) {
            fprintf(stderr, "ERROR: cannot open dump file %s\n", fname);
            return 99;
        }
        fputc(strm->bits_per_sample, fp);
        bflags = strm->block_size >> 8;
        if (strm->flags | AEC_DATA_MSB)
            bflags |= 0x80;
        if (strm->flags | AEC_DATA_SIGNED)
            bflags |= 0x40;
        if (strm->flags | AEC_DATA_3BYTE)
            bflags |= 0x10;
        bflags |= 0x20; /* encode */
        fputc(bflags, fp);
        fwrite(strm->next_in, strm->avail_in, 1, fp);
        fclose(fp);
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    if (state->dump) {
        char fname[1024 + 3];
        FILE *fp;
        snprintf(fname, sizeof(fname), "%s.rz", fbase);
        if ((fp = fopen(fname, "wb")) == NULL) {
            fprintf(stderr, "ERROR: cannot open dump file %s\n", fname);
            return 99;
        }
        fputc(strm->bits_per_sample, fp);
        bflags &= ~0x20;
        fputc(bflags, fp);
        fwrite(state->cbuf, strm->total_out, 1, fp);
        fclose(fp);
    }

    strm->avail_in = strm->total_out;
    strm->avail_out = state->buf_len;
    strm->next_in = state->cbuf;
    strm->next_out = state->obuf;
    to = strm->total_out;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %zu", to);
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}